

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_face_tec_zone(REF_FACELIFT ref_facelift,REF_INT id,FILE *file)

{
  REF_DBL RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_GRID pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  void *__ptr;
  double dVar7;
  double dVar8;
  double dVar9;
  char *pcVar10;
  REF_INT local_278;
  REF_INT local_274;
  REF_INT local_240;
  REF_INT local_23c;
  int local_238;
  REF_INT local_234;
  int local_200;
  REF_INT local_1fc;
  int local_1f8;
  REF_INT local_1f4;
  int local_1bc;
  REF_INT local_1b8;
  REF_INT local_1b4;
  REF_INT local_1b0;
  int local_1ac;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyz [3];
  REF_DBL local_118;
  REF_DBL param [2];
  REF_DBL *uv;
  REF_INT sens;
  REF_INT ntri;
  REF_INT nnode_degen;
  REF_INT nnode_sens0;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  REF_INT local_64;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict_degen;
  REF_DICT ref_dict_jump;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  FILE *file_local;
  REF_FACELIFT pRStack_18;
  REF_INT id_local;
  REF_FACELIFT ref_facelift_local;
  
  ref_node = (REF_NODE)ref_facelift->grid;
  ref_cell = (REF_CELL)((REF_GRID)ref_node)->node;
  ref_geom = (REF_GEOM)ref_facelift->tri_cell;
  ref_dict = (REF_DICT)ref_facelift->grid->geom;
  ref_grid = (REF_GRID)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_facelift;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x44e,"ref_facelift_face_tec_zone","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    uVar5 = ref_dict_create(&ref_dict_jump);
    if (uVar5 == 0) {
      uVar5 = ref_dict_create(&ref_dict_degen);
      if (uVar5 == 0) {
        uVar5 = ref_dict_create((REF_DICT *)&cell);
        if (uVar5 == 0) {
          for (local_64 = 0; local_64 < ref_dict->max; local_64 = local_64 + 1) {
            if ((ref_dict->key[local_64 * 6] == 2) &&
               (nnode_sens0 = ref_dict->key[local_64 * 6 + 5],
               file_local._4_4_ == ref_dict->key[local_64 * 6 + 1])) {
              if (ref_dict->key[local_64 * 6 + 4] == 0) {
                uVar5 = ref_dict_store(ref_dict_jump,nnode_sens0,local_64);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x458,"ref_facelift_face_tec_zone",(ulong)uVar5,"mark nodes");
                  return uVar5;
                }
                if ((ref_dict->key[local_64 * 6 + 3] != 0) &&
                   (uVar5 = ref_dict_store(ref_dict_degen,nnode_sens0,local_64), uVar5 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x45a,"ref_facelift_face_tec_zone",(ulong)uVar5,"mark jump");
                  return uVar5;
                }
              }
              else {
                if ((nnode_sens0 < 0) ||
                   (*(int *)ref_geom->segments_per_radian_of_curvature <= nnode_sens0)) {
                  local_1ac = -1;
                }
                else {
                  local_1ac = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature +
                                                8) + (long)nnode_sens0 * 4);
                }
                node = local_1ac;
                if (local_1ac == -1) {
                  local_1b0 = -1;
                }
                else {
                  local_1b0 = *(REF_INT *)
                               (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) +
                                4 + (long)local_1ac * 8);
                }
                nodes[0x1a] = local_1b0;
                while (node != -1) {
                  uVar5 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x45e,"ref_facelift_face_tec_zone",(ulong)uVar5,"nodes");
                    return uVar5;
                  }
                  if ((file_local._4_4_ == nodes[1]) &&
                     (uVar5 = ref_dict_store(_cell,nodes[0x1a],nnode_sens0), uVar5 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x460,"ref_facelift_face_tec_zone",(ulong)uVar5,"mark degen");
                    return uVar5;
                  }
                  node = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10)
                                 + (long)node * 8);
                  if (node == -1) {
                    local_1b4 = -1;
                  }
                  else {
                    local_1b4 = *(REF_INT *)
                                 (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10)
                                  + 4 + (long)node * 8);
                  }
                  nodes[0x1a] = local_1b4;
                }
              }
            }
          }
          ntri = ref_dict_jump->n;
          sens = ref_dict_jump->n + ref_dict_degen->n;
          nnode_degen = ref_dict_jump->n + ref_dict_degen->n + _cell->n;
          uv._4_4_ = 0;
          for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
              nodes[0x1a] = nodes[0x1a] + 1) {
            RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
            if ((RVar6 == 0) && (file_local._4_4_ == nodes[1])) {
              uv._4_4_ = uv._4_4_ + 1;
            }
          }
          if ((nnode_degen == 0) || (uv._4_4_ == 0)) {
            uVar5 = ref_dict_free(_cell);
            if (uVar5 == 0) {
              uVar5 = ref_dict_free(ref_dict_degen);
              if (uVar5 == 0) {
                ref_facelift_local._4_4_ = ref_dict_free(ref_dict_jump);
                if (ref_facelift_local._4_4_ == 0) {
                  ref_facelift_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x477,"ref_facelift_face_tec_zone",(ulong)ref_facelift_local._4_4_,
                         "free dict");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x476,"ref_facelift_face_tec_zone",(ulong)uVar5,"free jump");
                ref_facelift_local._4_4_ = uVar5;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x475,"ref_facelift_face_tec_zone",(ulong)uVar5,"free degen");
              ref_facelift_local._4_4_ = uVar5;
            }
          }
          else {
            pcVar10 = "fetriangle";
            fprintf((FILE *)ref_grid,
                    "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)file_local._4_4_,(ulong)(uint)nnode_degen,(ulong)uv._4_4_,"point",
                    "fetriangle");
            if (nnode_degen * 2 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x480,"ref_facelift_face_tec_zone","malloc uv of REF_DBL negative");
              ref_facelift_local._4_4_ = 1;
            }
            else {
              __ptr = malloc((long)(nnode_degen << 1) << 3);
              if (__ptr == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x480,"ref_facelift_face_tec_zone","malloc uv of REF_DBL NULL");
                ref_facelift_local._4_4_ = 2;
              }
              else {
                for (ref_private_macro_code_rss_11 = 0;
                    SBORROW4(ref_private_macro_code_rss_11,nnode_degen * 2) !=
                    ref_private_macro_code_rss_11 + nnode_degen * -2 < 0;
                    ref_private_macro_code_rss_11 = ref_private_macro_code_rss_11 + 1) {
                  *(undefined8 *)((long)__ptr + (long)ref_private_macro_code_rss_11 * 8) =
                       0xbff0000000000000;
                }
                for (nodes[0x1a] = 0;
                    nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
                  if ((RVar6 == 0) && (file_local._4_4_ == nodes[1])) {
                    for (nnode_sens0 = 0; nnode_sens0 < *(int *)&ref_geom->field_0xc;
                        nnode_sens0 = nnode_sens0 + 1) {
                      uVar5 = ref_geom_find((REF_GEOM)ref_dict,(&local)[nnode_sens0],2,
                                            file_local._4_4_,&local_64);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x485,"ref_facelift_face_tec_zone",(ulong)uVar5,"find");
                        return uVar5;
                      }
                      uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,(&local)[nnode_sens0],&local,2,
                                                &local_118,(REF_INT *)&uv);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x488,"ref_facelift_face_tec_zone",(ulong)uVar5,"cell tuv");
                        return uVar5;
                      }
                      if (ref_dict->key[local_64 * 6 + 4] == 0) {
                        if (((int)uv == 0) || ((int)uv == 1)) {
                          uVar5 = ref_dict_location(ref_dict_jump,(&local)[nnode_sens0],&nnode);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x48b,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                            return uVar5;
                          }
                        }
                        else {
                          uVar5 = ref_dict_location(ref_dict_degen,(&local)[nnode_sens0],&nnode);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x48e,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                            return uVar5;
                          }
                          nnode = ntri + nnode;
                        }
                      }
                      else {
                        uVar5 = ref_dict_location(_cell,nodes[0x1a],&nnode);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,0x492,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                          return uVar5;
                        }
                        nnode = sens + nnode;
                      }
                      *(REF_DBL *)((long)__ptr + (long)(nnode << 1) * 8) = local_118;
                      *(REF_DBL *)((long)__ptr + (long)(nnode * 2 + 1) * 8) = param[0];
                    }
                  }
                }
                node = 0;
                if (ref_dict_jump->n < 1) {
                  local_1b8 = -1;
                }
                else {
                  local_1b8 = *ref_dict_jump->key;
                }
                nnode_sens0 = local_1b8;
                if (ref_dict_jump->n < 1) {
                  local_1bc = -1;
                }
                else {
                  local_1bc = *ref_dict_jump->value;
                }
                local_64 = local_1bc;
                while (node < ref_dict_jump->n) {
                  _ref_private_macro_code_rss_1 =
                       *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                  xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                  xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                  if ((ref_dict[4].key != (REF_INT *)0x0) &&
                     (uVar5 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                                (REF_DBL *)((long)__ptr + (long)(node << 1) * 8),
                                                (REF_DBL *)&ref_private_macro_code_rss_1,
                                                (REF_DBL *)0x0), uVar5 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x4a2,"ref_facelift_face_tec_zone",(ulong)uVar5,"eval at",pcVar10);
                    return uVar5;
                  }
                  pRVar4 = ref_grid;
                  RVar3 = xyz[1];
                  RVar2 = xyz[0];
                  RVar1 = _ref_private_macro_code_rss_1;
                  dVar7 = pow(pRStack_18->displacement[local_64 * 3],2.0);
                  dVar8 = pow(pRStack_18->displacement[local_64 * 3 + 1],2.0);
                  dVar9 = pow(pRStack_18->displacement[local_64 * 3 + 2],2.0);
                  dVar7 = sqrt(dVar7 + dVar8 + dVar9);
                  pcVar10 = (char *)pRStack_18->displacement[local_64 * 3 + 2];
                  fprintf((FILE *)pRVar4," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          RVar1,RVar2,RVar3,SUB84(dVar7,0),
                          *(undefined8 *)((long)__ptr + (long)(node << 1) * 8),
                          *(undefined8 *)((long)__ptr + (long)(node * 2 + 1) * 8),
                          pRStack_18->displacement[local_64 * 3],
                          pRStack_18->displacement[local_64 * 3 + 1]);
                  node = node + 1;
                  if ((node < 0) || (ref_dict_jump->n <= node)) {
                    local_1f4 = -1;
                  }
                  else {
                    local_1f4 = ref_dict_jump->key[node];
                  }
                  nnode_sens0 = local_1f4;
                  if ((node < 0) || (ref_dict_jump->n <= node)) {
                    local_1f8 = -1;
                  }
                  else {
                    local_1f8 = ref_dict_jump->value[node];
                  }
                  local_64 = local_1f8;
                }
                node = 0;
                if (ref_dict_degen->n < 1) {
                  local_1fc = -1;
                }
                else {
                  local_1fc = *ref_dict_degen->key;
                }
                nnode_sens0 = local_1fc;
                if (ref_dict_degen->n < 1) {
                  local_200 = -1;
                }
                else {
                  local_200 = *ref_dict_degen->value;
                }
                local_64 = local_200;
                while (node < ref_dict_degen->n) {
                  _ref_private_macro_code_rss_1 =
                       *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                  xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                  xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                  if ((ref_dict[4].key != (REF_INT *)0x0) &&
                     (uVar5 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                                (REF_DBL *)
                                                ((long)__ptr + (long)((ntri + node) * 2) * 8),
                                                (REF_DBL *)&ref_private_macro_code_rss_1,
                                                (REF_DBL *)0x0), uVar5 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x4b2,"ref_facelift_face_tec_zone",(ulong)uVar5,"eval at",pcVar10);
                    return uVar5;
                  }
                  pRVar4 = ref_grid;
                  RVar3 = xyz[1];
                  RVar2 = xyz[0];
                  RVar1 = _ref_private_macro_code_rss_1;
                  dVar7 = pow(pRStack_18->displacement[local_64 * 3],2.0);
                  dVar8 = pow(pRStack_18->displacement[local_64 * 3 + 1],2.0);
                  dVar9 = pow(pRStack_18->displacement[local_64 * 3 + 2],2.0);
                  dVar7 = sqrt(dVar7 + dVar8 + dVar9);
                  pcVar10 = (char *)pRStack_18->displacement[local_64 * 3 + 2];
                  fprintf((FILE *)pRVar4," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          RVar1,RVar2,RVar3,SUB84(dVar7,0),
                          *(undefined8 *)((long)__ptr + (long)((ntri + node) * 2) * 8),
                          *(undefined8 *)((long)__ptr + (long)((ntri + node) * 2 + 1) * 8),
                          pRStack_18->displacement[local_64 * 3],
                          pRStack_18->displacement[local_64 * 3 + 1]);
                  node = node + 1;
                  if ((node < 0) || (ref_dict_degen->n <= node)) {
                    local_234 = -1;
                  }
                  else {
                    local_234 = ref_dict_degen->key[node];
                  }
                  nnode_sens0 = local_234;
                  if ((node < 0) || (ref_dict_degen->n <= node)) {
                    local_238 = -1;
                  }
                  else {
                    local_238 = ref_dict_degen->value[node];
                  }
                  local_64 = local_238;
                }
                node = 0;
                if (_cell->n < 1) {
                  local_23c = -1;
                }
                else {
                  local_23c = *_cell->key;
                }
                nodes[0x1a] = local_23c;
                if (_cell->n < 1) {
                  local_240 = -1;
                }
                else {
                  local_240 = *_cell->value;
                }
                nnode_sens0 = local_240;
                while (node < _cell->n) {
                  uVar5 = ref_geom_find((REF_GEOM)ref_dict,nnode_sens0,2,file_local._4_4_,&local_64)
                  ;
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x4bc,"ref_facelift_face_tec_zone",(ulong)uVar5,"find",pcVar10);
                    return uVar5;
                  }
                  _ref_private_macro_code_rss_1 =
                       *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                  xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                  xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                  if ((ref_dict[4].key != (REF_INT *)0x0) &&
                     (uVar5 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                                (REF_DBL *)
                                                ((long)__ptr + (long)((sens + node) * 2) * 8),
                                                (REF_DBL *)&ref_private_macro_code_rss_1,
                                                (REF_DBL *)0x0), uVar5 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x4c3,"ref_facelift_face_tec_zone",(ulong)uVar5,"eval at",pcVar10);
                    return uVar5;
                  }
                  pRVar4 = ref_grid;
                  RVar3 = xyz[1];
                  RVar2 = xyz[0];
                  RVar1 = _ref_private_macro_code_rss_1;
                  dVar7 = pow(pRStack_18->displacement[local_64 * 3],2.0);
                  dVar8 = pow(pRStack_18->displacement[local_64 * 3 + 1],2.0);
                  dVar9 = pow(pRStack_18->displacement[local_64 * 3 + 2],2.0);
                  dVar7 = sqrt(dVar7 + dVar8 + dVar9);
                  pcVar10 = (char *)pRStack_18->displacement[local_64 * 3 + 2];
                  fprintf((FILE *)pRVar4," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                          RVar1,RVar2,RVar3,SUB84(dVar7,0),
                          *(undefined8 *)((long)__ptr + (long)((sens + node) * 2) * 8),
                          *(undefined8 *)((long)__ptr + (long)((sens + node) * 2 + 1) * 8),
                          pRStack_18->displacement[local_64 * 3],
                          pRStack_18->displacement[local_64 * 3 + 1]);
                  node = node + 1;
                  if ((node < 0) || (_cell->n <= node)) {
                    local_274 = -1;
                  }
                  else {
                    local_274 = _cell->key[node];
                  }
                  nodes[0x1a] = local_274;
                  if ((node < 0) || (_cell->n <= node)) {
                    local_278 = -1;
                  }
                  else {
                    local_278 = _cell->value[node];
                  }
                  nnode_sens0 = local_278;
                }
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
                for (nodes[0x1a] = 0;
                    nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
                  if ((RVar6 == 0) && (file_local._4_4_ == nodes[1])) {
                    for (nnode_sens0 = 0; nnode_sens0 < *(int *)&ref_geom->field_0xc;
                        nnode_sens0 = nnode_sens0 + 1) {
                      uVar5 = ref_geom_find((REF_GEOM)ref_dict,(&local)[nnode_sens0],2,
                                            file_local._4_4_,&local_64);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x4d2,"ref_facelift_face_tec_zone",(ulong)uVar5,"find");
                        return uVar5;
                      }
                      uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,(&local)[nnode_sens0],&local,2,
                                                &local_118,(REF_INT *)&uv);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x4d5,"ref_facelift_face_tec_zone",(ulong)uVar5,"cell tuv");
                        return uVar5;
                      }
                      if (ref_dict->key[local_64 * 6 + 4] == 0) {
                        if (((int)uv == 0) || ((int)uv == 1)) {
                          uVar5 = ref_dict_location(ref_dict_jump,(&local)[nnode_sens0],&nnode);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4d8,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                            return uVar5;
                          }
                        }
                        else {
                          uVar5 = ref_dict_location(ref_dict_degen,(&local)[nnode_sens0],&nnode);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4db,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                            return uVar5;
                          }
                          nnode = ntri + nnode;
                        }
                      }
                      else {
                        uVar5 = ref_dict_location(_cell,nodes[0x1a],&nnode);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,0x4df,"ref_facelift_face_tec_zone",(ulong)uVar5,"localize");
                          return uVar5;
                        }
                        nnode = sens + nnode;
                      }
                      fprintf((FILE *)ref_grid," %d",(ulong)(nnode + 1));
                    }
                    fprintf((FILE *)ref_grid,"\n");
                  }
                }
                uVar5 = ref_dict_free(_cell);
                if (uVar5 == 0) {
                  uVar5 = ref_dict_free(ref_dict_degen);
                  if (uVar5 == 0) {
                    ref_facelift_local._4_4_ = ref_dict_free(ref_dict_jump);
                    if (ref_facelift_local._4_4_ == 0) {
                      ref_facelift_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x4ea,"ref_facelift_face_tec_zone",(ulong)ref_facelift_local._4_4_,
                             "free dict");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x4e9,"ref_facelift_face_tec_zone",(ulong)uVar5,"free jump");
                    ref_facelift_local._4_4_ = uVar5;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x4e8,"ref_facelift_face_tec_zone",(ulong)uVar5,"free degen");
                  ref_facelift_local._4_4_ = uVar5;
                }
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x452,"ref_facelift_face_tec_zone",(ulong)uVar5,"create dict");
          ref_facelift_local._4_4_ = uVar5;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x451,"ref_facelift_face_tec_zone",(ulong)uVar5,"create dict");
        ref_facelift_local._4_4_ = uVar5;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x450,"ref_facelift_face_tec_zone",(ulong)uVar5,"create dict");
      ref_facelift_local._4_4_ = uVar5;
    }
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_face_tec_zone(REF_FACELIFT ref_facelift,
                                                     REF_INT id, FILE *file) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_facelift_tri(ref_facelift);
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DICT ref_dict, ref_dict_jump, ref_dict_degen;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nnode_sens0, nnode_degen, ntri;
  REF_INT sens;
  REF_DBL *uv, param[2];
  REF_DBL xyz[3];

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  RSS(ref_dict_create(&ref_dict), "create dict");
  RSS(ref_dict_create(&ref_dict_jump), "create dict");
  RSS(ref_dict_create(&ref_dict_degen), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (id == ref_geom_id(ref_geom, geom)) {
      if (0 == ref_geom_degen(ref_geom, geom)) {
        RSS(ref_dict_store(ref_dict, node, geom), "mark nodes");
        if (0 != ref_geom_jump(ref_geom, geom)) {
          RSS(ref_dict_store(ref_dict_jump, node, geom), "mark jump");
        }
      } else {
        each_ref_cell_having_node(ref_cell, node, item, cell) {
          RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
          if (id == nodes[3]) {
            RSS(ref_dict_store(ref_dict_degen, cell, node), "mark degen");
          }
        }
      }
    }
  }

  nnode_sens0 = ref_dict_n(ref_dict);
  nnode_degen = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump);
  nnode = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump) +
          ref_dict_n(ref_dict_degen);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict_degen), "free degen");
    RSS(ref_dict_free(ref_dict_jump), "free jump");
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  ref_malloc_init(uv, 2 * nnode, REF_DBL, -1.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        uv[0 + 2 * local] = param[0];
        uv[1 + 2 * local] = param[1];
      }
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, &(uv[2 * item]), xyz,
                            NULL),
          "eval at");
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
            xyz[0], xyz[1], xyz[2], ref_facelift_distance(ref_facelift, geom),
            uv[0 + 2 * item], uv[1 + 2 * item],
            ref_facelift_displacement(ref_facelift, 0, geom),
            ref_facelift_displacement(ref_facelift, 1, geom),
            ref_facelift_displacement(ref_facelift, 2, geom));
  }
  each_ref_dict_key_value(ref_dict_jump, item, node, geom) {
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_sens0 + item)]), xyz, NULL),
          "eval at");
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
            xyz[0], xyz[1], xyz[2], ref_facelift_distance(ref_facelift, geom),
            uv[0 + 2 * (nnode_sens0 + item)], uv[1 + 2 * (nnode_sens0 + item)],
            ref_facelift_displacement(ref_facelift, 0, geom),
            ref_facelift_displacement(ref_facelift, 1, geom),
            ref_facelift_displacement(ref_facelift, 2, geom));
  }
  each_ref_dict_key_value(ref_dict_degen, item, cell, node) {
    RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "find");
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_degen + item)]), xyz, NULL),
          "eval at");
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
            xyz[0], xyz[1], xyz[2], ref_facelift_distance(ref_facelift, geom),
            uv[0 + 2 * (nnode_degen + item)], uv[1 + 2 * (nnode_degen + item)],
            ref_facelift_displacement(ref_facelift, 0, geom),
            ref_facelift_displacement(ref_facelift, 1, geom),
            ref_facelift_displacement(ref_facelift, 2, geom));
  }
  ref_free(uv);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict_degen), "free degen");
  RSS(ref_dict_free(ref_dict_jump), "free jump");
  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}